

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

Entry * __thiscall PartitionTable::firstoftype(PartitionTable *this,int type)

{
  Entry *pEVar1;
  Entry *pEVar2;
  long lVar3;
  
  pEVar2 = this[-1]._table + 3;
  lVar3 = 5;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return (Entry *)0x0;
    }
    pEVar1 = pEVar2 + 1;
    pEVar2 = pEVar2 + 1;
  } while ((uint)pEVar1->_type != type);
  return pEVar2;
}

Assistant:

Entry* firstoftype(int type)
    {
        for (int i=0 ; i<4 ; i++)
            if (_table[i].type()==type)
                return &_table[i];
        return 0;
    }